

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

int RegexTree::number_node
              (unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
               *m,tree_node *ptr,int i)

{
  __hashtable *__h;
  
  if (ptr->left != (tree_node *)0x0) {
    i = number_node(m,ptr->left,i);
  }
  if ((ptr->right != (tree_node *)0x0) &&
     (i = number_node(m,ptr->right,i), ptr->right != (tree_node *)0x0)) {
    return i;
  }
  if (ptr->left == (tree_node *)0x0) {
    std::
    _Hashtable<tree_node_const*,std::pair<tree_node_const*const,int>,std::allocator<std::pair<tree_node_const*const,int>>,std::__detail::_Select1st,std::equal_to<tree_node_const*>,std::hash<tree_node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<tree_node_const*const,int>>
              ((_Hashtable<tree_node_const*,std::pair<tree_node_const*const,int>,std::allocator<std::pair<tree_node_const*const,int>>,std::__detail::_Select1st,std::equal_to<tree_node_const*>,std::hash<tree_node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)m);
    i = i + 1;
  }
  return i;
}

Assistant:

int RegexTree::number_node(std::unordered_map<const tree_node *, int> &m, tree_node *ptr, int i) {
    if (ptr->left != nullptr) {
        i = number_node(m, ptr->left, i);
    }
    if (ptr->right != nullptr) {
        i = number_node(m, ptr->right, i);
    }
    if (ptr->right == nullptr && ptr->left == nullptr) {
        m.insert({ptr, i});
        return i + 1;
    }
    return i;
}